

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall
kj::_::EagerPromiseNodeBase::EagerPromiseNodeBase
          (EagerPromiseNodeBase *this,OwnPromiseNode *dependencyParam,ExceptionOrValue *resultRef,
          SourceLocation location)

{
  PromiseNode *pPVar1;
  
  (this->super_PromiseNode).super_PromiseArenaMember.arena = (PromiseArena *)0x0;
  (this->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember =
       (_func_int **)&PTR___cxa_pure_virtual_0036d340;
  Event::Event(&this->super_Event,location);
  (this->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember =
       (_func_int **)&PTR___cxa_pure_virtual_0036d208;
  (this->super_Event)._vptr_Event = (_func_int **)&PTR_traceEvent_0036d250;
  (this->dependency).ptr = dependencyParam->ptr;
  dependencyParam->ptr = (PromiseNode *)0x0;
  (this->onReadyEvent).event = (Event *)0x0;
  this->resultRef = resultRef;
  pPVar1 = (this->dependency).ptr;
  (*(pPVar1->super_PromiseArenaMember)._vptr_PromiseArenaMember[2])(pPVar1,&this->dependency);
  pPVar1 = (this->dependency).ptr;
  (*(pPVar1->super_PromiseArenaMember)._vptr_PromiseArenaMember[1])(pPVar1,&this->super_Event);
  return;
}

Assistant:

EagerPromiseNodeBase::EagerPromiseNodeBase(
    OwnPromiseNode&& dependencyParam, ExceptionOrValue& resultRef, SourceLocation location)
    : Event(location), dependency(kj::mv(dependencyParam)), resultRef(resultRef) {
  dependency->setSelfPointer(&dependency);
  dependency->onReady(this);
}